

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

double Logger::log(double __x)

{
  char in_AL;
  OutputSink *pOVar1;
  char *in_RSI;
  uint in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  undefined1 local_f8 [48];
  double local_c8;
  int local_44;
  char *pcStack_40;
  int err;
  char *buffer;
  va_list argp;
  char *format_local;
  uint flags_local;
  
  if (in_AL != '\0') {
    local_c8 = __x;
  }
  argp[0].overflow_arg_area = local_f8;
  argp[0]._0_8_ = &stack0x00000008;
  buffer._4_4_ = 0x30;
  buffer._0_4_ = 0x10;
  pcStack_40 = (char *)0x0;
  local_44 = vasprintf(&stack0xffffffffffffffc0,in_RSI,&buffer);
  dVar2 = extraout_XMM0_Qa;
  if (0 < local_44) {
    pOVar1 = getDefaultSink();
    (*pOVar1->_vptr_OutputSink[1])(pOVar1,pcStack_40,(ulong)in_EDI);
    free(pcStack_40);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(const unsigned int flags, const char * format, ...)
    {
        va_list argp;
        va_start(argp, format);
        char * buffer = 0;
        // We use vasprintf extension to avoid dual parsing of the format string to find out the required length
        const int err = vasprintf(&buffer, format, argp);
        if (err <= 0) return;
        getDefaultSink().gotMessage(buffer, flags);
        free(buffer);
    }